

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O2

bool __thiscall reflection::Object::Verify(Object *this,Verifier *verifier)

{
  bool bVar1;
  String *pSVar2;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *pVVar3;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *pVVar4;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *pVVar5;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>(&this->super_Table,verifier,4),
     bVar1)) {
    pSVar2 = name(this);
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar2);
    if ((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>
                          (&this->super_Table,verifier,6), bVar1)) {
      pVVar3 = fields(this);
      bVar1 = flatbuffers::VerifierTemplate<false>::
              VerifyVector<flatbuffers::Offset<reflection::Field>,_unsigned_int>(verifier,pVVar3);
      if (bVar1) {
        pVVar3 = fields(this);
        bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::Field>
                          (verifier,pVVar3);
        if ((((bVar1) &&
             (bVar1 = flatbuffers::Table::VerifyField<unsigned_char>
                                (&this->super_Table,verifier,8,1), bVar1)) &&
            (bVar1 = flatbuffers::Table::VerifyField<int>(&this->super_Table,verifier,10,4), bVar1))
           && ((bVar1 = flatbuffers::Table::VerifyField<int>(&this->super_Table,verifier,0xc,4),
               bVar1 && (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                           (&this->super_Table,verifier,0xe), bVar1)))) {
          pVVar4 = attributes(this);
          bVar1 = flatbuffers::VerifierTemplate<false>::
                  VerifyVector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>
                            (verifier,pVVar4);
          if (bVar1) {
            pVVar4 = attributes(this);
            bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::KeyValue>
                              (verifier,pVVar4);
            if ((bVar1) &&
               (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                  (&this->super_Table,verifier,0x10), bVar1)) {
              pVVar5 = documentation(this);
              bVar1 = flatbuffers::VerifierTemplate<false>::
                      VerifyVector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>
                                (verifier,pVVar5);
              if (bVar1) {
                pVVar5 = documentation(this);
                bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfStrings(verifier,pVVar5)
                ;
                if ((bVar1) &&
                   (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                      (&this->super_Table,verifier,0x12), bVar1)) {
                  pSVar2 = declaration_file(this);
                  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar2);
                  if (bVar1) {
                    verifier->depth_ = verifier->depth_ - 1;
                    return true;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffsetRequired(verifier, VT_NAME) &&
           verifier.VerifyString(name()) &&
           VerifyOffsetRequired(verifier, VT_FIELDS) &&
           verifier.VerifyVector(fields()) &&
           verifier.VerifyVectorOfTables(fields()) &&
           VerifyField<uint8_t>(verifier, VT_IS_STRUCT, 1) &&
           VerifyField<int32_t>(verifier, VT_MINALIGN, 4) &&
           VerifyField<int32_t>(verifier, VT_BYTESIZE, 4) &&
           VerifyOffset(verifier, VT_ATTRIBUTES) &&
           verifier.VerifyVector(attributes()) &&
           verifier.VerifyVectorOfTables(attributes()) &&
           VerifyOffset(verifier, VT_DOCUMENTATION) &&
           verifier.VerifyVector(documentation()) &&
           verifier.VerifyVectorOfStrings(documentation()) &&
           VerifyOffset(verifier, VT_DECLARATION_FILE) &&
           verifier.VerifyString(declaration_file()) &&
           verifier.EndTable();
  }